

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall cmComputeTargetDepends::CollectTargets(cmComputeTargetDepends *this)

{
  _Head_base<0UL,_cmLocalGenerator_*,_false> _Var1;
  pointer puVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  mapped_type *pmVar5;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *ti;
  pointer puVar6;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lgen;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> local_50;
  pointer local_48;
  pointer local_40;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *local_38;
  
  local_48 = (this->GlobalGenerator->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
             &this->Targets;
  for (local_40 = (this->GlobalGenerator->LocalGenerators).
                  super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; local_40 != local_48;
      local_40 = local_40 + 1) {
    _Var1._M_head_impl =
         (local_40->_M_t).
         super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
         super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
         super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    puVar2 = *(pointer *)((long)&(_Var1._M_head_impl)->GeneratorTargets + 8);
    for (puVar6 = *(pointer *)
                   &((_Var1._M_head_impl)->GeneratorTargets).
                    super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
        ; puVar6 != puVar2; puVar6 = puVar6 + 1) {
      ppcVar3 = (this->Targets).
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppcVar4 = (this->Targets).
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_50.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
      _M_t.super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
      super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
           (puVar6->_M_t).
           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
      pmVar5 = std::
               map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
               ::operator[](&this->TargetIndex,(key_type *)&local_50);
      *pmVar5 = (mapped_type)((ulong)((long)ppcVar3 - (long)ppcVar4) >> 3);
      local_50.super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
      _M_t.super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
      super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
           (puVar6->_M_t).
           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>;
      std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
      emplace_back<cmGeneratorTarget_const*>(local_38,(cmGeneratorTarget **)&local_50);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargets()
{
  // Collect all targets from all generators.
  auto const& lgens = this->GlobalGenerator->GetLocalGenerators();
  for (const auto& lgen : lgens) {
    for (const auto& ti : lgen->GetGeneratorTargets()) {
      int index = static_cast<int>(this->Targets.size());
      this->TargetIndex[ti.get()] = index;
      this->Targets.push_back(ti.get());
    }
  }
}